

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  vbool<4> vVar12;
  char cVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  undefined4 uVar17;
  uint uVar18;
  ulong uVar19;
  RayQueryContext *pRVar20;
  RayQueryContext *extraout_RDX;
  NodeRef root;
  size_t sVar21;
  size_t sVar22;
  Intersectors *pIVar23;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar24;
  ulong uVar25;
  NodeRef *pNVar26;
  int iVar27;
  float fVar28;
  float fVar29;
  float fVar46;
  float fVar47;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar48;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [16];
  float fVar53;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar50;
  undefined1 auVar54 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [16];
  float fVar61;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar62 [16];
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  float fVar73;
  uint uVar74;
  uint uVar76;
  uint uVar77;
  undefined1 auVar75 [16];
  uint uVar78;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar79 [16];
  vfloat4 a0;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar96;
  float fVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar98;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar11 = mm_lookupmask_ps._8_8_;
  uVar10 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar22 = (bvh->root).ptr;
  if (sVar22 != 8) {
    auVar54 = *(undefined1 (*) [16])(ray + 0x80);
    auVar49._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar54._0_4_);
    auVar49._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar54._4_4_);
    auVar49._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar54._8_4_);
    auVar49._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar54._12_4_);
    uVar18 = movmskps((int)context,auVar49);
    if (uVar18 != 0) {
      uVar19 = (ulong)(uVar18 & 0xff);
      pRVar20 = (RayQueryContext *)pre.ray_space;
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar61 = tray.dir.field_0._0_4_;
      fVar63 = tray.dir.field_0._4_4_;
      fVar64 = tray.dir.field_0._8_4_;
      fVar65 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar48 = tray.dir.field_0._16_4_;
      fVar51 = tray.dir.field_0._20_4_;
      fVar52 = tray.dir.field_0._24_4_;
      fVar53 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar56 = tray.dir.field_0._32_4_;
      fVar58 = tray.dir.field_0._36_4_;
      fVar59 = tray.dir.field_0._40_4_;
      fVar60 = tray.dir.field_0._44_4_;
      auVar75._0_4_ = fVar48 * fVar48 + fVar56 * fVar56;
      auVar75._4_4_ = fVar51 * fVar51 + fVar58 * fVar58;
      auVar75._8_4_ = fVar52 * fVar52 + fVar59 * fVar59;
      auVar75._12_4_ = fVar53 * fVar53 + fVar60 * fVar60;
      auVar83._0_4_ = fVar61 * fVar61 + auVar75._0_4_;
      auVar83._4_4_ = fVar63 * fVar63 + auVar75._4_4_;
      auVar83._8_4_ = fVar64 * fVar64 + auVar75._8_4_;
      auVar83._12_4_ = fVar65 * fVar65 + auVar75._12_4_;
      auVar75 = rsqrtps(auVar75,auVar83);
      fVar73 = auVar75._0_4_;
      fVar28 = auVar75._4_4_;
      fVar29 = auVar75._8_4_;
      fVar46 = auVar75._12_4_;
      pre.depth_scale.field_0.v[0] = fVar73 * fVar73 * auVar83._0_4_ * -0.5 * fVar73 + fVar73 * 1.5;
      pre.depth_scale.field_0.v[1] = fVar28 * fVar28 * auVar83._4_4_ * -0.5 * fVar28 + fVar28 * 1.5;
      pre.depth_scale.field_0.v[2] = fVar29 * fVar29 * auVar83._8_4_ * -0.5 * fVar29 + fVar29 * 1.5;
      pre.depth_scale.field_0.v[3] = fVar46 * fVar46 * auVar83._12_4_ * -0.5 * fVar46 + fVar46 * 1.5
      ;
      do {
        lVar4 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        auVar83 = insertps(ZEXT416(*(uint *)(ray + lVar4 * 4 + 0x40)),
                           *(undefined4 *)(ray + lVar4 * 4 + 0x50),0x1c);
        auVar83 = insertps(auVar83,*(undefined4 *)(ray + lVar4 * 4 + 0x60),0x28);
        fVar73 = *(float *)((long)pre.ray_space + lVar4 * 4 + -0x10);
        auVar84._0_4_ = auVar83._0_4_ * fVar73;
        auVar84._4_4_ = auVar83._4_4_ * fVar73;
        auVar84._8_4_ = auVar83._8_4_ * fVar73;
        auVar84._12_4_ = auVar83._12_4_ * fVar73;
        uVar25 = CONCAT44(auVar84._4_4_,auVar84._4_4_);
        auVar30._0_8_ = uVar25 ^ 0x8000000080000000;
        auVar30._8_4_ = -auVar84._12_4_;
        auVar30._12_4_ = -auVar84._12_4_;
        auVar83 = blendps(auVar30,ZEXT816(0),0xe);
        auVar93._4_4_ = auVar83._0_4_;
        auVar93._0_4_ = auVar84._8_4_;
        auVar93._8_4_ = auVar83._4_4_;
        auVar93._12_4_ = 0;
        auVar92._4_4_ = auVar83._0_4_;
        auVar92._0_4_ = auVar84._8_4_;
        auVar92._8_4_ = auVar83._4_4_;
        auVar92._12_4_ = 0;
        auVar92 = dpps(auVar92 << 0x20,auVar93 << 0x20,0x7f);
        uVar25 = CONCAT44(auVar84._12_4_,auVar84._8_4_);
        auVar86._0_8_ = uVar25 ^ 0x8000000080000000;
        auVar86._8_4_ = -auVar84._8_4_;
        auVar86._12_4_ = -auVar84._12_4_;
        auVar75 = insertps(auVar86,auVar84,0x2a);
        auVar83 = dpps(auVar75,auVar75,0x7f);
        iVar27 = -(uint)(auVar83._0_4_ < auVar92._0_4_);
        auVar31._4_4_ = iVar27;
        auVar31._0_4_ = iVar27;
        auVar31._8_4_ = iVar27;
        auVar31._12_4_ = iVar27;
        auVar83 = blendvps(auVar75,auVar93 << 0x20,auVar31);
        auVar75 = dpps(auVar83,auVar83,0x7f);
        auVar93 = rsqrtss(auVar75,auVar75);
        fVar28 = auVar93._0_4_;
        fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * auVar75._0_4_ * 0.5 * fVar28;
        fVar29 = fVar28 * auVar83._0_4_;
        fVar46 = fVar28 * auVar83._4_4_;
        fVar47 = fVar28 * auVar83._8_4_;
        fVar28 = fVar28 * auVar83._12_4_;
        fVar85 = fVar46 * auVar84._0_4_ - auVar84._4_4_ * fVar29;
        fVar88 = fVar47 * auVar84._4_4_ - auVar84._8_4_ * fVar46;
        fVar89 = fVar29 * auVar84._8_4_ - auVar84._0_4_ * fVar47;
        auVar87._12_4_ = fVar28 * auVar84._12_4_ - auVar84._12_4_ * fVar28;
        auVar87._0_8_ = CONCAT44(fVar89,fVar88);
        auVar87._8_4_ = fVar85;
        auVar90._8_4_ = fVar85;
        auVar90._0_8_ = auVar87._0_8_;
        auVar90._12_4_ = auVar87._12_4_;
        auVar83 = dpps(auVar90,auVar87,0x7f);
        pIVar23 = (Intersectors *)(uVar19 - 1);
        auVar75 = rsqrtss(auVar83,auVar83);
        fVar28 = auVar75._0_4_;
        fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * auVar83._0_4_ * 0.5 * fVar28;
        aVar32.m128[1] = fVar28 * fVar85;
        aVar32.m128[0] = fVar47;
        aVar32.m128[2] = auVar84._8_4_ * fVar73;
        aVar32.m128[3] = 0.0;
        (((LinearSpace3fa *)((long)pRVar20 + lVar4 * 0x30))->vx).field_0.m128[0] = fVar29;
        pre.ray_space[lVar4].vx.field_0.m128[1] = fVar28 * fVar88;
        pre.ray_space[lVar4].vx.field_0.m128[2] = auVar84._0_4_ * fVar73;
        pre.ray_space[lVar4].vx.field_0.m128[3] = 0.0;
        aVar9.m128[1] = fVar28 * fVar89;
        aVar9.m128[0] = fVar46;
        aVar9.m128[2] = auVar84._4_4_ * fVar73;
        aVar9.m128[3] = 0.0;
        pre.ray_space[lVar4].vy.field_0 = aVar9;
        pre.ray_space[lVar4].vz.field_0 = aVar32;
        uVar19 = uVar19 & (ulong)pIVar23;
      } while (uVar19 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      fVar73 = (float)DAT_01f80d30;
      fVar28 = DAT_01f80d30._4_4_;
      fVar29 = DAT_01f80d30._8_4_;
      fVar46 = DAT_01f80d30._12_4_;
      auVar33._4_4_ = -(uint)(ABS(fVar63) < fVar28);
      auVar33._0_4_ = -(uint)(ABS(fVar61) < fVar73);
      auVar33._8_4_ = -(uint)(ABS(fVar64) < fVar29);
      auVar33._12_4_ = -(uint)(ABS(fVar65) < fVar46);
      auVar92 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f80d30,auVar33)
      ;
      auVar34._4_4_ = -(uint)(ABS(fVar51) < fVar28);
      auVar34._0_4_ = -(uint)(ABS(fVar48) < fVar73);
      auVar34._8_4_ = -(uint)(ABS(fVar52) < fVar29);
      auVar34._12_4_ = -(uint)(ABS(fVar53) < fVar46);
      auVar75 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f80d30,auVar34)
      ;
      auVar35._4_4_ = -(uint)(ABS(fVar58) < fVar28);
      auVar35._0_4_ = -(uint)(ABS(fVar56) < fVar73);
      auVar35._8_4_ = -(uint)(ABS(fVar59) < fVar29);
      auVar35._12_4_ = -(uint)(ABS(fVar60) < fVar46);
      auVar93 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f80d30,auVar35)
      ;
      auVar83 = rcpps(auVar35,auVar92);
      fVar48 = auVar83._0_4_;
      auVar62._0_4_ = auVar92._0_4_ * fVar48;
      fVar51 = auVar83._4_4_;
      auVar62._4_4_ = auVar92._4_4_ * fVar51;
      fVar52 = auVar83._8_4_;
      auVar62._8_4_ = auVar92._8_4_ * fVar52;
      fVar53 = auVar83._12_4_;
      auVar62._12_4_ = auVar92._12_4_ * fVar53;
      tray.rdir.field_0._0_4_ = (1.0 - auVar62._0_4_) * fVar48 + fVar48;
      tray.rdir.field_0._4_4_ = (1.0 - auVar62._4_4_) * fVar51 + fVar51;
      tray.rdir.field_0._8_4_ = (1.0 - auVar62._8_4_) * fVar52 + fVar52;
      tray.rdir.field_0._12_4_ = (1.0 - auVar62._12_4_) * fVar53 + fVar53;
      auVar83 = rcpps(auVar62,auVar75);
      fVar48 = auVar83._0_4_;
      fVar51 = auVar83._4_4_;
      fVar52 = auVar83._8_4_;
      fVar53 = auVar83._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar75._0_4_ * fVar48) * fVar48 + fVar48;
      tray.rdir.field_0._20_4_ = (1.0 - auVar75._4_4_ * fVar51) * fVar51 + fVar51;
      tray.rdir.field_0._24_4_ = (1.0 - auVar75._8_4_ * fVar52) * fVar52 + fVar52;
      tray.rdir.field_0._28_4_ = (1.0 - auVar75._12_4_ * fVar53) * fVar53 + fVar53;
      auVar83 = rcpps(auVar83,auVar93);
      fVar48 = auVar83._0_4_;
      fVar51 = auVar83._4_4_;
      fVar52 = auVar83._8_4_;
      fVar53 = auVar83._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar93._0_4_ * fVar48) * fVar48 + fVar48;
      tray.rdir.field_0._36_4_ = (1.0 - auVar93._4_4_ * fVar51) * fVar51 + fVar51;
      tray.rdir.field_0._40_4_ = (1.0 - auVar93._8_4_ * fVar52) * fVar52 + fVar52;
      tray.rdir.field_0._44_4_ = (1.0 - auVar93._12_4_ * fVar53) * fVar53 + fVar53;
      auVar57._0_12_ = ZEXT812(0);
      auVar57._12_4_ = 0;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar36._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar36._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar36._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar36._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar36);
      auVar37._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar37._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar37._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar37._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar37);
      auVar83 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar57);
      auVar54 = maxps(auVar54,auVar57);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar83,auVar49);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar54,auVar49);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar54 ^ auVar49);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar18 = 3;
      }
      else {
        uVar18 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar26 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar24 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = sVar22;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar15 = 0x21d2f80;
      aVar50 = _DAT_01f7a9f0;
LAB_0023d0d0:
      do {
        do {
          root.ptr = pNVar26[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0023d6bd;
          pNVar26 = pNVar26 + -1;
          paVar24 = paVar24 + -1;
          aVar55.v = *(__m128 *)paVar24->v;
          auVar38._4_4_ = -(uint)(aVar55.v[1] < tray.tfar.field_0.v[1]);
          auVar38._0_4_ = -(uint)(aVar55.v[0] < tray.tfar.field_0.v[0]);
          auVar38._8_4_ = -(uint)(aVar55.v[2] < tray.tfar.field_0.v[2]);
          auVar38._12_4_ = -(uint)(aVar55._12_4_ < tray.tfar.field_0.v[3]);
          uVar15 = movmskps(uVar15,auVar38);
        } while (uVar15 == 0);
        uVar19 = (ulong)(byte)uVar15;
        uVar16 = POPCOUNT(uVar15 & 0xff);
        uVar66 = uVar16;
        if (uVar18 < uVar16) {
LAB_0023d10e:
          do {
            vVar12.field_0 = terminated.field_0;
            uVar15 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0023d6bd;
              auVar44._4_4_ = -(uint)(aVar55.v[1] < tray.tfar.field_0.v[1]);
              auVar44._0_4_ = -(uint)(aVar55.v[0] < tray.tfar.field_0.v[0]);
              auVar44._8_4_ = -(uint)(aVar55.v[2] < tray.tfar.field_0.v[2]);
              auVar44._12_4_ = -(uint)(aVar55.v[3] < tray.tfar.field_0.v[3]);
              uVar15 = movmskps(uVar66,auVar44);
              if (uVar15 != 0) {
                bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                uVar19 = (ulong)bVar1;
                pvVar3 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar11;
                valid_o.field_0._0_8_ = uVar10;
                uVar15 = movmskps((int)pRVar20,(undefined1  [16])terminated.field_0);
                uVar15 = uVar15 ^ 0xf;
                pRVar20 = (RayQueryContext *)(ulong)uVar15;
                if (uVar15 != 0) {
                  uVar25 = (ulong)(byte)uVar15;
                  do {
                    lVar4 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                      }
                    }
                    pIVar23 = (Intersectors *)&pre;
                    cVar13 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x18))
                                       (pIVar23,ray,lVar4,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar13 != '\0') {
                      valid_o.field_0.i[lVar4] = -1;
                    }
                    uVar19 = uVar25 - 1;
                    uVar25 = uVar25 & uVar19;
                    pRVar20 = extraout_RDX;
                    aVar50 = _DAT_01f7a9f0;
                  } while (uVar25 != 0);
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])valid_o.field_0 | (undefined1  [16])vVar12.field_0);
                uVar15 = movmskps((int)uVar19,(undefined1  [16])terminated.field_0);
                if (uVar15 == 0xf) goto LAB_0023d6bd;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_0023d0d0;
            }
            uVar19 = root.ptr & 0xfffffffffffffff0;
            pRVar20 = (RayQueryContext *)0x1c;
            sVar22 = 8;
            aVar99 = aVar50;
            do {
              sVar2 = *(size_t *)((uVar19 - 0xe0) + (long)pRVar20 * 8);
              sVar21 = sVar22;
              aVar55 = aVar50;
              if (sVar2 == 8) break;
              if ((root.ptr & 7) == 0) {
                fVar48 = *(float *)((root.ptr - 0x50) + (long)pRVar20 * 4);
                fVar58 = *(float *)((root.ptr - 0x40) + (long)pRVar20 * 4);
                fVar51 = *(float *)((root.ptr - 0x30) + (long)pRVar20 * 4);
                fVar61 = *(float *)((root.ptr - 0x20) + (long)pRVar20 * 4);
                fVar47 = (fVar48 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                fVar85 = (fVar48 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                fVar88 = (fVar48 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                fVar63 = (fVar48 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
                ;
                fVar48 = (fVar51 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
                ;
                fVar53 = (fVar51 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
                ;
                fVar59 = (fVar51 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
                ;
                fVar51 = (fVar51 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
                ;
                fVar52 = *(float *)((root.ptr - 0x10) + (long)pRVar20 * 4);
                fVar56 = (fVar52 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_
                ;
                fVar60 = (fVar52 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_
                ;
                fVar64 = (fVar52 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_
                ;
                fVar52 = (fVar52 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_
                ;
                fVar73 = (fVar58 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                fVar28 = (fVar58 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                fVar29 = (fVar58 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                fVar46 = (fVar58 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_
                ;
                fVar89 = (fVar61 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_
                ;
                fVar80 = (fVar61 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_
                ;
                fVar81 = (fVar61 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_
                ;
                fVar82 = (fVar61 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_
                ;
                fVar58 = *(float *)(root.ptr + (long)pRVar20 * 4);
                auVar94._0_4_ =
                     (fVar58 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
                auVar94._4_4_ =
                     (fVar58 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
                auVar94._8_4_ =
                     (fVar58 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
                auVar94._12_4_ =
                     (fVar58 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              }
              else {
                fVar48 = *(float *)((uVar19 - 0x50) + (long)pRVar20 * 4);
                fVar51 = *(float *)((uVar19 - 0x40) + (long)pRVar20 * 4);
                fVar52 = *(float *)((uVar19 - 0x30) + (long)pRVar20 * 4);
                fVar53 = *(float *)((uVar19 - 0x20) + (long)pRVar20 * 4);
                fVar56 = *(float *)((uVar19 - 0x10) + (long)pRVar20 * 4);
                fVar58 = *(float *)(uVar19 + (long)pRVar20 * 4);
                fVar59 = *(float *)(uVar19 + 0x10 + (long)pRVar20 * 4);
                fVar60 = *(float *)(uVar19 + 0x20 + (long)pRVar20 * 4);
                fVar61 = *(float *)(uVar19 + 0x30 + (long)pRVar20 * 4);
                auVar79._0_4_ =
                     (float)tray.dir.field_0._16_4_ * fVar58 +
                     (float)tray.dir.field_0._32_4_ * fVar61;
                auVar79._4_4_ =
                     (float)tray.dir.field_0._20_4_ * fVar58 +
                     (float)tray.dir.field_0._36_4_ * fVar61;
                auVar79._8_4_ =
                     (float)tray.dir.field_0._24_4_ * fVar58 +
                     (float)tray.dir.field_0._40_4_ * fVar61;
                auVar79._12_4_ =
                     (float)tray.dir.field_0._28_4_ * fVar58 +
                     (float)tray.dir.field_0._44_4_ * fVar61;
                auVar101._0_4_ =
                     fVar48 * (float)tray.dir.field_0._0_4_ +
                     fVar53 * (float)tray.dir.field_0._16_4_ +
                     fVar59 * (float)tray.dir.field_0._32_4_;
                auVar101._4_4_ =
                     fVar48 * (float)tray.dir.field_0._4_4_ +
                     fVar53 * (float)tray.dir.field_0._20_4_ +
                     fVar59 * (float)tray.dir.field_0._36_4_;
                auVar101._8_4_ =
                     fVar48 * (float)tray.dir.field_0._8_4_ +
                     fVar53 * (float)tray.dir.field_0._24_4_ +
                     fVar59 * (float)tray.dir.field_0._40_4_;
                auVar101._12_4_ =
                     fVar48 * (float)tray.dir.field_0._12_4_ +
                     fVar53 * (float)tray.dir.field_0._28_4_ +
                     fVar59 * (float)tray.dir.field_0._44_4_;
                auVar95._0_4_ =
                     fVar51 * (float)tray.dir.field_0._0_4_ +
                     fVar56 * (float)tray.dir.field_0._16_4_ +
                     fVar60 * (float)tray.dir.field_0._32_4_;
                auVar95._4_4_ =
                     fVar51 * (float)tray.dir.field_0._4_4_ +
                     fVar56 * (float)tray.dir.field_0._20_4_ +
                     fVar60 * (float)tray.dir.field_0._36_4_;
                auVar95._8_4_ =
                     fVar51 * (float)tray.dir.field_0._8_4_ +
                     fVar56 * (float)tray.dir.field_0._24_4_ +
                     fVar60 * (float)tray.dir.field_0._40_4_;
                auVar95._12_4_ =
                     fVar51 * (float)tray.dir.field_0._12_4_ +
                     fVar56 * (float)tray.dir.field_0._28_4_ +
                     fVar60 * (float)tray.dir.field_0._44_4_;
                uVar66 = (uint)DAT_01f7b6c0;
                uVar16 = DAT_01f7b6c0._4_4_;
                uVar69 = DAT_01f7b6c0._8_4_;
                uVar71 = DAT_01f7b6c0._12_4_;
                fVar63 = (float)DAT_01f80d30;
                fVar64 = DAT_01f80d30._4_4_;
                fVar65 = DAT_01f80d30._8_4_;
                fVar73 = DAT_01f80d30._12_4_;
                auVar40._4_4_ = -(uint)((float)((uint)auVar101._4_4_ & uVar16) < fVar64);
                auVar40._0_4_ = -(uint)((float)((uint)auVar101._0_4_ & uVar66) < fVar63);
                auVar40._8_4_ = -(uint)((float)((uint)auVar101._8_4_ & uVar69) < fVar65);
                auVar40._12_4_ = -(uint)((float)((uint)auVar101._12_4_ & uVar71) < fVar73);
                auVar93 = blendvps(auVar101,_DAT_01f80d30,auVar40);
                auVar41._4_4_ = -(uint)((float)((uint)auVar95._4_4_ & uVar16) < fVar64);
                auVar41._0_4_ = -(uint)((float)((uint)auVar95._0_4_ & uVar66) < fVar63);
                auVar41._8_4_ = -(uint)((float)((uint)auVar95._8_4_ & uVar69) < fVar65);
                auVar41._12_4_ = -(uint)((float)((uint)auVar95._12_4_ & uVar71) < fVar73);
                auVar83 = blendvps(auVar95,_DAT_01f80d30,auVar41);
                auVar100._0_4_ = (float)tray.dir.field_0._0_4_ * fVar52 + auVar79._0_4_;
                auVar100._4_4_ = (float)tray.dir.field_0._4_4_ * fVar52 + auVar79._4_4_;
                auVar100._8_4_ = (float)tray.dir.field_0._8_4_ * fVar52 + auVar79._8_4_;
                auVar100._12_4_ = (float)tray.dir.field_0._12_4_ * fVar52 + auVar79._12_4_;
                auVar42._4_4_ = -(uint)((float)((uint)auVar100._4_4_ & uVar16) < fVar64);
                auVar42._0_4_ = -(uint)((float)((uint)auVar100._0_4_ & uVar66) < fVar63);
                auVar42._8_4_ = -(uint)((float)((uint)auVar100._8_4_ & uVar69) < fVar65);
                auVar42._12_4_ = -(uint)((float)((uint)auVar100._12_4_ & uVar71) < fVar73);
                auVar75 = blendvps(auVar100,_DAT_01f80d30,auVar42);
                auVar54 = rcpps(auVar79,auVar93);
                fVar73 = auVar54._0_4_;
                fVar28 = auVar54._4_4_;
                fVar29 = auVar54._8_4_;
                fVar46 = auVar54._12_4_;
                fVar73 = (1.0 - auVar93._0_4_ * fVar73) * fVar73 + fVar73;
                fVar28 = (1.0 - auVar93._4_4_ * fVar28) * fVar28 + fVar28;
                fVar29 = (1.0 - auVar93._8_4_ * fVar29) * fVar29 + fVar29;
                fVar46 = (1.0 - auVar93._12_4_ * fVar46) * fVar46 + fVar46;
                auVar54 = rcpps(_DAT_01f7b6c0,auVar83);
                fVar89 = auVar54._0_4_;
                fVar80 = auVar54._4_4_;
                fVar81 = auVar54._8_4_;
                fVar82 = auVar54._12_4_;
                fVar89 = (1.0 - auVar83._0_4_ * fVar89) * fVar89 + fVar89;
                fVar80 = (1.0 - auVar83._4_4_ * fVar80) * fVar80 + fVar80;
                fVar81 = (1.0 - auVar83._8_4_ * fVar81) * fVar81 + fVar81;
                fVar82 = (1.0 - auVar83._12_4_ * fVar82) * fVar82 + fVar82;
                auVar54 = rcpps(auVar54,auVar75);
                fVar91 = auVar54._0_4_;
                fVar96 = auVar54._4_4_;
                fVar97 = auVar54._8_4_;
                fVar98 = auVar54._12_4_;
                fVar63 = *(float *)(uVar19 + 0x40 + (long)pRVar20 * 4);
                fVar91 = (1.0 - auVar75._0_4_ * fVar91) * fVar91 + fVar91;
                fVar96 = (1.0 - auVar75._4_4_ * fVar96) * fVar96 + fVar96;
                fVar97 = (1.0 - auVar75._8_4_ * fVar97) * fVar97 + fVar97;
                fVar98 = (1.0 - auVar75._12_4_ * fVar98) * fVar98 + fVar98;
                fVar64 = *(float *)(uVar19 + 0x50 + (long)pRVar20 * 4);
                fVar65 = *(float *)(uVar19 + 0x60 + (long)pRVar20 * 4);
                fVar47 = (fVar48 * (float)tray.org.field_0._0_4_ +
                         fVar53 * (float)tray.org.field_0._16_4_ +
                         fVar59 * (float)tray.org.field_0._32_4_ + fVar63) * -fVar73;
                fVar85 = (fVar48 * (float)tray.org.field_0._4_4_ +
                         fVar53 * (float)tray.org.field_0._20_4_ +
                         fVar59 * (float)tray.org.field_0._36_4_ + fVar63) * -fVar28;
                fVar88 = (fVar48 * (float)tray.org.field_0._8_4_ +
                         fVar53 * (float)tray.org.field_0._24_4_ +
                         fVar59 * (float)tray.org.field_0._40_4_ + fVar63) * -fVar29;
                fVar63 = (fVar48 * (float)tray.org.field_0._12_4_ +
                         fVar53 * (float)tray.org.field_0._28_4_ +
                         fVar59 * (float)tray.org.field_0._44_4_ + fVar63) * -fVar46;
                fVar48 = (fVar51 * (float)tray.org.field_0._0_4_ +
                         fVar56 * (float)tray.org.field_0._16_4_ +
                         fVar60 * (float)tray.org.field_0._32_4_ + fVar64) * -fVar89;
                fVar53 = (fVar51 * (float)tray.org.field_0._4_4_ +
                         fVar56 * (float)tray.org.field_0._20_4_ +
                         fVar60 * (float)tray.org.field_0._36_4_ + fVar64) * -fVar80;
                fVar59 = (fVar51 * (float)tray.org.field_0._8_4_ +
                         fVar56 * (float)tray.org.field_0._24_4_ +
                         fVar60 * (float)tray.org.field_0._40_4_ + fVar64) * -fVar81;
                fVar51 = (fVar51 * (float)tray.org.field_0._12_4_ +
                         fVar56 * (float)tray.org.field_0._28_4_ +
                         fVar60 * (float)tray.org.field_0._44_4_ + fVar64) * -fVar82;
                fVar56 = (fVar52 * (float)tray.org.field_0._0_4_ +
                         fVar58 * (float)tray.org.field_0._16_4_ +
                         fVar61 * (float)tray.org.field_0._32_4_ + fVar65) * -fVar91;
                fVar60 = (fVar52 * (float)tray.org.field_0._4_4_ +
                         fVar58 * (float)tray.org.field_0._20_4_ +
                         fVar61 * (float)tray.org.field_0._36_4_ + fVar65) * -fVar96;
                fVar64 = (fVar52 * (float)tray.org.field_0._8_4_ +
                         fVar58 * (float)tray.org.field_0._24_4_ +
                         fVar61 * (float)tray.org.field_0._40_4_ + fVar65) * -fVar97;
                fVar52 = (fVar52 * (float)tray.org.field_0._12_4_ +
                         fVar58 * (float)tray.org.field_0._28_4_ +
                         fVar61 * (float)tray.org.field_0._44_4_ + fVar65) * -fVar98;
                fVar73 = fVar73 + fVar47;
                fVar28 = fVar28 + fVar85;
                fVar29 = fVar29 + fVar88;
                fVar46 = fVar46 + fVar63;
                fVar89 = fVar89 + fVar48;
                fVar80 = fVar80 + fVar53;
                fVar81 = fVar81 + fVar59;
                fVar82 = fVar82 + fVar51;
                auVar94._0_4_ = fVar91 + fVar56;
                auVar94._4_4_ = fVar96 + fVar60;
                auVar94._8_4_ = fVar97 + fVar64;
                auVar94._12_4_ = fVar98 + fVar52;
                aVar99 = _DAT_01f7a9f0;
              }
              uVar66 = (uint)((int)fVar73 < (int)fVar47) * (int)fVar73 |
                       (uint)((int)fVar73 >= (int)fVar47) * (int)fVar47;
              uVar16 = (uint)((int)fVar28 < (int)fVar85) * (int)fVar28 |
                       (uint)((int)fVar28 >= (int)fVar85) * (int)fVar85;
              uVar69 = (uint)((int)fVar29 < (int)fVar88) * (int)fVar29 |
                       (uint)((int)fVar29 >= (int)fVar88) * (int)fVar88;
              uVar71 = (uint)((int)fVar46 < (int)fVar63) * (int)fVar46 |
                       (uint)((int)fVar46 >= (int)fVar63) * (int)fVar63;
              uVar74 = (uint)((int)fVar89 < (int)fVar48) * (int)fVar89 |
                       (uint)((int)fVar89 >= (int)fVar48) * (int)fVar48;
              uVar76 = (uint)((int)fVar80 < (int)fVar53) * (int)fVar80 |
                       (uint)((int)fVar80 >= (int)fVar53) * (int)fVar53;
              uVar77 = (uint)((int)fVar81 < (int)fVar59) * (int)fVar81 |
                       (uint)((int)fVar81 >= (int)fVar59) * (int)fVar59;
              uVar78 = (uint)((int)fVar82 < (int)fVar51) * (int)fVar82 |
                       (uint)((int)fVar82 >= (int)fVar51) * (int)fVar51;
              uVar74 = ((int)uVar74 < (int)uVar66) * uVar66 | ((int)uVar74 >= (int)uVar66) * uVar74;
              uVar76 = ((int)uVar76 < (int)uVar16) * uVar16 | ((int)uVar76 >= (int)uVar16) * uVar76;
              uVar77 = ((int)uVar77 < (int)uVar69) * uVar69 | ((int)uVar77 >= (int)uVar69) * uVar77;
              uVar78 = ((int)uVar78 < (int)uVar71) * uVar71 | ((int)uVar78 >= (int)uVar71) * uVar78;
              iVar27 = auVar94._0_4_;
              uVar66 = (uint)(iVar27 < (int)fVar56) * iVar27 |
                       (uint)(iVar27 >= (int)fVar56) * (int)fVar56;
              iVar5 = auVar94._4_4_;
              uVar16 = (uint)(iVar5 < (int)fVar60) * iVar5 |
                       (uint)(iVar5 >= (int)fVar60) * (int)fVar60;
              iVar6 = auVar94._8_4_;
              uVar69 = (uint)(iVar6 < (int)fVar64) * iVar6 |
                       (uint)(iVar6 >= (int)fVar64) * (int)fVar64;
              iVar7 = auVar94._12_4_;
              uVar71 = (uint)(iVar7 < (int)fVar52) * iVar7 |
                       (uint)(iVar7 >= (int)fVar52) * (int)fVar52;
              uVar67 = ((int)uVar66 < (int)uVar74) * uVar74 | ((int)uVar66 >= (int)uVar74) * uVar66;
              uVar68 = ((int)uVar16 < (int)uVar76) * uVar76 | ((int)uVar16 >= (int)uVar76) * uVar16;
              uVar70 = ((int)uVar69 < (int)uVar77) * uVar77 | ((int)uVar69 >= (int)uVar77) * uVar69;
              uVar72 = ((int)uVar71 < (int)uVar78) * uVar78 | ((int)uVar71 >= (int)uVar78) * uVar71;
              uVar74 = (uint)((int)fVar47 < (int)fVar73) * (int)fVar73 |
                       (uint)((int)fVar47 >= (int)fVar73) * (int)fVar47;
              uVar76 = (uint)((int)fVar85 < (int)fVar28) * (int)fVar28 |
                       (uint)((int)fVar85 >= (int)fVar28) * (int)fVar85;
              uVar77 = (uint)((int)fVar88 < (int)fVar29) * (int)fVar29 |
                       (uint)((int)fVar88 >= (int)fVar29) * (int)fVar88;
              uVar78 = (uint)((int)fVar63 < (int)fVar46) * (int)fVar46 |
                       (uint)((int)fVar63 >= (int)fVar46) * (int)fVar63;
              uVar66 = (uint)((int)fVar48 < (int)fVar89) * (int)fVar89 |
                       (uint)((int)fVar48 >= (int)fVar89) * (int)fVar48;
              uVar16 = (uint)((int)fVar53 < (int)fVar80) * (int)fVar80 |
                       (uint)((int)fVar53 >= (int)fVar80) * (int)fVar53;
              uVar69 = (uint)((int)fVar59 < (int)fVar81) * (int)fVar81 |
                       (uint)((int)fVar59 >= (int)fVar81) * (int)fVar59;
              uVar71 = (uint)((int)fVar51 < (int)fVar82) * (int)fVar82 |
                       (uint)((int)fVar51 >= (int)fVar82) * (int)fVar51;
              uVar66 = ((int)uVar74 < (int)uVar66) * uVar74 | ((int)uVar74 >= (int)uVar66) * uVar66;
              uVar16 = ((int)uVar76 < (int)uVar16) * uVar76 | ((int)uVar76 >= (int)uVar16) * uVar16;
              uVar69 = ((int)uVar77 < (int)uVar69) * uVar77 | ((int)uVar77 >= (int)uVar69) * uVar69;
              uVar71 = ((int)uVar78 < (int)uVar71) * uVar78 | ((int)uVar78 >= (int)uVar71) * uVar71;
              uVar74 = (uint)((int)fVar56 < iVar27) * iVar27 |
                       (uint)((int)fVar56 >= iVar27) * (int)fVar56;
              uVar76 = (uint)((int)fVar60 < iVar5) * iVar5 |
                       (uint)((int)fVar60 >= iVar5) * (int)fVar60;
              uVar77 = (uint)((int)fVar64 < iVar6) * iVar6 |
                       (uint)((int)fVar64 >= iVar6) * (int)fVar64;
              uVar78 = (uint)((int)fVar52 < iVar7) * iVar7 |
                       (uint)((int)fVar52 >= iVar7) * (int)fVar52;
              uVar66 = ((int)uVar66 < (int)uVar74) * uVar66 | ((int)uVar66 >= (int)uVar74) * uVar74;
              uVar16 = ((int)uVar16 < (int)uVar76) * uVar16 | ((int)uVar16 >= (int)uVar76) * uVar76;
              uVar69 = ((int)uVar69 < (int)uVar77) * uVar69 | ((int)uVar69 >= (int)uVar77) * uVar77;
              uVar71 = ((int)uVar71 < (int)uVar78) * uVar71 | ((int)uVar71 >= (int)uVar78) * uVar78;
              auVar39._4_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[1] < (int)uVar68) * uVar68 |
                                  (uint)(tray.tnear.field_0.i[1] >= (int)uVar68) *
                                  tray.tnear.field_0.i[1]) <=
                          (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar16) *
                                  tray.tfar.field_0.i[1] |
                                 (tray.tfar.field_0.i[1] >= (int)uVar16) * uVar16));
              auVar39._0_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[0] < (int)uVar67) * uVar67 |
                                  (uint)(tray.tnear.field_0.i[0] >= (int)uVar67) *
                                  tray.tnear.field_0.i[0]) <=
                          (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar66) *
                                  tray.tfar.field_0.i[0] |
                                 (tray.tfar.field_0.i[0] >= (int)uVar66) * uVar66));
              auVar39._8_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[2] < (int)uVar70) * uVar70 |
                                  (uint)(tray.tnear.field_0.i[2] >= (int)uVar70) *
                                  tray.tnear.field_0.i[2]) <=
                          (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar69) *
                                  tray.tfar.field_0.i[2] |
                                 (tray.tfar.field_0.i[2] >= (int)uVar69) * uVar69));
              auVar39._12_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[3] < (int)uVar72) * uVar72 |
                                  (uint)(tray.tnear.field_0.i[3] >= (int)uVar72) *
                                  tray.tnear.field_0.i[3]) <=
                          (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar71) *
                                  tray.tfar.field_0.i[3] |
                                 (tray.tfar.field_0.i[3] >= (int)uVar71) * uVar71));
              uVar66 = movmskps((int)pIVar23,auVar39);
              pIVar23 = (Intersectors *)(ulong)uVar66;
              if ((uVar66 != 0) &&
                 (auVar8._4_4_ = uVar68, auVar8._0_4_ = uVar67, auVar8._8_4_ = uVar70,
                 auVar8._12_4_ = uVar72, aVar55.v = (__m128)blendvps(aVar99.v,auVar8,auVar39),
                 sVar21 = sVar2, sVar22 != 8)) {
                pNVar26->ptr = sVar22;
                pNVar26 = pNVar26 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar24->v = aVar50;
                paVar24 = paVar24 + 1;
              }
              aVar50 = aVar55;
              pRVar20 = (RayQueryContext *)((long)&pRVar20->scene + 1);
              sVar22 = sVar21;
              aVar55 = aVar50;
            } while (pRVar20 != (RayQueryContext *)&DAT_00000020);
            aVar50 = aVar99;
            if (sVar21 == 8) goto LAB_0023d4f9;
            auVar43._4_4_ = -(uint)(aVar55.v[1] < tray.tfar.field_0.v[1]);
            auVar43._0_4_ = -(uint)(aVar55.v[0] < tray.tfar.field_0.v[0]);
            auVar43._8_4_ = -(uint)(aVar55.v[2] < tray.tfar.field_0.v[2]);
            auVar43._12_4_ = -(uint)(aVar55.v[3] < tray.tfar.field_0.v[3]);
            uVar17 = movmskps((int)root.ptr,auVar43);
            root.ptr = sVar21;
            uVar66 = POPCOUNT(uVar17);
          } while ((byte)uVar18 < (byte)POPCOUNT(uVar17));
          pNVar26->ptr = sVar21;
          pNVar26 = pNVar26 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar24->v = aVar55;
          paVar24 = paVar24 + 1;
        }
        else {
          do {
            sVar22 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> sVar22 & 1) == 0; sVar22 = sVar22 + 1) {
              }
            }
            pIVar23 = This;
            pRVar20 = context;
            bVar14 = occluded1(This,bvh,root,sVar22,&pre,ray,&tray,context);
            if (bVar14) {
              terminated.field_0.i[sVar22] = -1;
            }
            uVar19 = uVar19 & uVar19 - 1;
          } while (uVar19 != 0);
          iVar27 = movmskps(0,(undefined1  [16])terminated.field_0);
          uVar15 = 3;
          if (iVar27 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar15 = 2;
          }
          aVar50 = _DAT_01f7a9f0;
          uVar66 = uVar15;
          if (uVar18 < uVar16) goto LAB_0023d10e;
        }
LAB_0023d4f9:
      } while (uVar15 != 3);
LAB_0023d6bd:
      auVar45._0_4_ = auVar49._0_4_ & terminated.field_0.i[0];
      auVar45._4_4_ = auVar49._4_4_ & terminated.field_0.i[1];
      auVar45._8_4_ = auVar49._8_4_ & terminated.field_0.i[2];
      auVar45._12_4_ = auVar49._12_4_ & terminated.field_0.i[3];
      auVar54 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar45);
      *(undefined1 (*) [16])(ray + 0x80) = auVar54;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }